

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::PromWriteByte25AA128(FpgaIO *this,uint16_t addr,uint8_t *data,uchar chan)

{
  byte bVar1;
  BasePort *pBVar2;
  uint uVar3;
  nodeaddr_t nVar4;
  bool bVar5;
  PromType local_4c;
  nodeaddr_t address;
  quadlet_t write_data;
  PromType prom_type;
  uchar chan_local;
  uint8_t *data_local;
  uint16_t addr_local;
  FpgaIO *this_local;
  
  if (chan == '\x01') {
    local_4c = PROM_25AA128_1;
  }
  else {
    local_4c = PROM_25AA128;
    if (chan == '\x02') {
      local_4c = PROM_25AA128_2;
    }
  }
  PromWriteEnable(this,local_4c);
  Amp1394_Sleep(0.0001);
  bVar1 = *data;
  nVar4 = GetPromAddress(this,local_4c,true);
  pBVar2 = (this->super_BoardIO).port;
  uVar3 = (*pBVar2->_vptr_BasePort[0x24])
                    (pBVar2,(ulong)(this->super_BoardIO).BoardId,nVar4,
                     (ulong)((uint)addr << 8 | 0x2000000 | (uint)bVar1));
  bVar5 = (uVar3 & 1) != 0;
  if (bVar5) {
    Amp1394_Sleep(0.005);
  }
  return bVar5;
}

Assistant:

bool FpgaIO::PromWriteByte25AA128(uint16_t addr, const uint8_t &data, unsigned char chan)
{
    PromType prom_type = (chan == 1) ? PROM_25AA128_1 : (chan == 2) ? PROM_25AA128_2 : PROM_25AA128;

    // enable write
    PromWriteEnable(prom_type);
    Amp1394_Sleep(0.0001);   // 100 usec

    // 8-bit cmd + 16-bit addr + 8-bit data
    quadlet_t write_data = 0x02000000|(addr << 8)|data;
    nodeaddr_t address = GetPromAddress(prom_type, true);
    if (port->WriteQuadlet(BoardId, address, write_data)) {
        // wait 5ms for the PROM to be ready to take new commands
        Amp1394_Sleep(0.005);
        return true;
    }
    else
        return false;
}